

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::EndOfFiles(ParsedScene *this)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer pAVar5;
  _Base_ptr p_Var6;
  iterator iVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  pointer ppVar11;
  _Base_ptr p_Var12;
  pointer ppVar13;
  pointer pSVar14;
  pointer pSVar15;
  pointer pAVar16;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unusedSpectrumTextures;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unusedFloatTextures;
  anon_class_16_2_322ff518 checkVec;
  
  if (this->currentBlock != WorldBlock) {
    (this->super_SceneRepresentation).errorExit = true;
    Error<>("End of files before \"WorldBegin\".");
  }
  while ((this->pushedGraphicsStates).
         super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->pushedGraphicsStates).
         super__Vector_base<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    (this->super_SceneRepresentation).errorExit = true;
    Error<>("Missing end to AttributeBegin");
    std::vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>
    ::pop_back(&this->pushedGraphicsStates);
  }
  if ((this->super_SceneRepresentation).errorExit == true) {
    ErrorExit<>("Fatal errors during scene construction");
  }
  unusedFloatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &unusedFloatTextures._M_t._M_impl.super__Rb_tree_header._M_header;
  unusedSpectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &unusedSpectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header;
  unusedFloatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unusedFloatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  unusedSpectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unusedSpectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  unusedFloatTextures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  unusedSpectrumTextures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar11 = (this->floatTextures).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->floatTextures).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  unusedSpectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       unusedSpectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  unusedFloatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       unusedFloatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if (ppVar11 == ppVar1) {
      ppVar11 = (this->spectrumTextures).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->spectrumTextures).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (ppVar11 == ppVar1) {
          ppVar2 = (this->namedMaterials).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          checkVec.unusedFloatTextures = &unusedFloatTextures;
          checkVec.unusedSpectrumTextures = &unusedSpectrumTextures;
          for (ppVar13 = (this->namedMaterials).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar2;
              ppVar13 = ppVar13 + 1) {
            EndOfFiles::anon_class_16_2_322ff518::operator()
                      (&checkVec,&(ppVar13->second).parameters.params);
          }
          pSVar3 = (this->materials).
                   super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          for (pSVar14 = (this->materials).
                         super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>.
                         _M_impl.super__Vector_impl_data._M_start; pSVar14 != pSVar3;
              pSVar14 = pSVar14 + 1) {
            EndOfFiles::anon_class_16_2_322ff518::operator()
                      (&checkVec,&(pSVar14->parameters).params);
          }
          ppVar1 = (this->floatTextures).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar11 = (this->floatTextures).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar1;
              ppVar11 = ppVar11 + 1) {
            EndOfFiles::anon_class_16_2_322ff518::operator()
                      (&checkVec,
                       &(ppVar11->second).super_TransformedSceneEntity.super_SceneEntity.parameters.
                        params);
          }
          ppVar1 = (this->spectrumTextures).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar11 = (this->spectrumTextures).
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar1;
              ppVar11 = ppVar11 + 1) {
            EndOfFiles::anon_class_16_2_322ff518::operator()
                      (&checkVec,
                       &(ppVar11->second).super_TransformedSceneEntity.super_SceneEntity.parameters.
                        params);
          }
          pSVar4 = (this->shapes).
                   super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pSVar15 = (this->shapes).
                         super__Vector_base<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>
                         ._M_impl.super__Vector_impl_data._M_start; pSVar15 != pSVar4;
              pSVar15 = pSVar15 + 1) {
            EndOfFiles::anon_class_16_2_322ff518::operator()
                      (&checkVec,&(pSVar15->super_SceneEntity).parameters.params);
          }
          pAVar5 = (this->animatedShapes).
                   super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pAVar16 = (this->animatedShapes).
                         super__Vector_base<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                         ._M_impl.super__Vector_impl_data._M_start; pAVar16 != pAVar5;
              pAVar16 = pAVar16 + 1) {
            EndOfFiles::anon_class_16_2_322ff518::operator()
                      (&checkVec,
                       &(pAVar16->super_TransformedSceneEntity).super_SceneEntity.parameters.params)
            ;
          }
          for (p_Var8 = (this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_left;
              p_Var9 = unusedFloatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
              (_Rb_tree_header *)p_Var8 !=
              &(this->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header;
              p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
            p_Var6 = *(_Base_ptr *)(p_Var8 + 4);
            for (p_Var12 = p_Var8[3]._M_right; p_Var12 != p_Var6; p_Var12 = p_Var12 + 9) {
              EndOfFiles::anon_class_16_2_322ff518::operator()
                        (&checkVec,(ParsedParameterVector *)(p_Var12 + 1));
            }
            p_Var6 = p_Var8[4]._M_right;
            for (p_Var12 = p_Var8[4]._M_left; p_Var12 != p_Var6;
                p_Var12 = (_Base_ptr)&p_Var12[0x1e]._M_left) {
              EndOfFiles::anon_class_16_2_322ff518::operator()
                        (&checkVec,(ParsedParameterVector *)(p_Var12 + 1));
            }
          }
          for (; p_Var10 = unusedSpectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left,
              (_Rb_tree_header *)p_Var9 != &unusedFloatTextures._M_t._M_impl.super__Rb_tree_header;
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
            if (LOGGING_LogLevel < 1) {
              Log<std::__cxx11::string_const&>
                        (Verbose,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                         ,0x1b6,"%s: float texture unused in scene",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var9 + 1));
            }
          }
          for (; (_Rb_tree_header *)p_Var10 !=
                 &unusedSpectrumTextures._M_t._M_impl.super__Rb_tree_header;
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
            if (LOGGING_LogLevel < 1) {
              Log<std::__cxx11::string_const&>
                        (Verbose,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                         ,0x1b8,"%s: spectrum texture unused in scene",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var10 + 1));
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&unusedSpectrumTextures._M_t);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&unusedFloatTextures._M_t);
          return;
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
                *)&checkVec,ppVar11);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&unusedSpectrumTextures._M_t,(key_type *)&checkVec);
        if ((_Rb_tree_header *)iVar7._M_node !=
            &unusedSpectrumTextures._M_t._M_impl.super__Rb_tree_header) break;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&unusedSpectrumTextures,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&checkVec);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
                 *)&checkVec);
        ppVar11 = ppVar11 + 1;
      }
      LogFatal<char_const(&)[69]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
                 ,0x18e,"Check failed: %s",
                 (char (*) [69])
                 "unusedSpectrumTextures.find(s.first) == unusedSpectrumTextures.end()");
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
            *)&checkVec,ppVar11);
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&unusedFloatTextures,(key_type *)&checkVec);
    if ((_Rb_tree_header *)iVar7._M_node != &unusedFloatTextures._M_t._M_impl.super__Rb_tree_header)
    break;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&unusedFloatTextures,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&checkVec);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
             *)&checkVec);
    ppVar11 = ppVar11 + 1;
  }
  LogFatal<char_const(&)[63]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/parsedscene.cpp"
             ,0x18a,"Check failed: %s",
             (char (*) [63])"unusedFloatTextures.find(f.first) == unusedFloatTextures.end()");
}

Assistant:

void ParsedScene::EndOfFiles() {
    if (currentBlock != BlockState::WorldBlock)
        ErrorExitDeferred("End of files before \"WorldBegin\".");

    // Ensure there are no pushed graphics states
    while (!pushedGraphicsStates.empty()) {
        ErrorExitDeferred("Missing end to AttributeBegin");
        pushedGraphicsStates.pop_back();
    }

    if (errorExit)
        ErrorExit("Fatal errors during scene construction");

    // LOG_VERBOSE messages about any unused textures..
    std::set<std::string> unusedFloatTextures, unusedSpectrumTextures;
    for (const auto f : floatTextures) {
        CHECK(unusedFloatTextures.find(f.first) == unusedFloatTextures.end());
        unusedFloatTextures.insert(f.first);
    }
    for (const auto s : spectrumTextures) {
        CHECK(unusedSpectrumTextures.find(s.first) == unusedSpectrumTextures.end());
        unusedSpectrumTextures.insert(s.first);
    }

    auto checkVec = [&](const ParsedParameterVector &vec) {
        for (const ParsedParameter *p : vec) {
            if (p->type == "texture") {
                CHECK(!p->strings.empty());
                if (auto iter = unusedFloatTextures.find(p->strings[0]);
                    iter != unusedFloatTextures.end())
                    unusedFloatTextures.erase(iter);
                else if (auto iter = unusedSpectrumTextures.find(p->strings[0]);
                         iter != unusedSpectrumTextures.end())
                    unusedSpectrumTextures.erase(iter);
            }
        }
    };

    // Walk through everything that uses textures..
    for (const auto &nm : namedMaterials)
        checkVec(nm.second.parameters.GetParameterVector());
    for (const auto &m : materials)
        checkVec(m.parameters.GetParameterVector());
    for (const auto &ft : floatTextures)
        checkVec(ft.second.parameters.GetParameterVector());
    for (const auto &st : spectrumTextures)
        checkVec(st.second.parameters.GetParameterVector());
    for (const auto &s : shapes)
        checkVec(s.parameters.GetParameterVector());
    for (const auto &as : animatedShapes)
        checkVec(as.parameters.GetParameterVector());
    for (const auto &id : instanceDefinitions) {
        for (const auto &s : id.second.shapes)
            checkVec(s.parameters.GetParameterVector());
        for (const auto &as : id.second.animatedShapes)
            checkVec(as.parameters.GetParameterVector());
    }

    // And complain about what's left.
    for (const std::string &s : unusedFloatTextures)
        LOG_VERBOSE("%s: float texture unused in scene", s);
    for (const std::string &s : unusedSpectrumTextures)
        LOG_VERBOSE("%s: spectrum texture unused in scene", s);
}